

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O0

bitset<256UL> * __thiscall
stored_bitfield::operator_cast_to_bitset(stored_bitfield<256UL,_32UL> *this)

{
  unsigned_long_long in_RSI;
  bitset<256UL> *in_RDI;
  size_t i;
  bitset<256UL> *this_00;
  bitset<256UL> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc8;
  bitset<256UL> *in_stack_ffffffffffffffd0;
  undefined8 local_10;
  
  this_00 = in_RDI;
  std::bitset<256UL>::bitset(in_stack_ffffffffffffffb0,in_RSI);
  for (local_10 = 0; local_10 < 0x20; local_10 = local_10 + 1) {
    std::bitset<256UL>::bitset(in_stack_ffffffffffffffb0,in_RSI);
    std::bitset<256UL>::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::bitset<256UL>::operator|=(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

operator std::bitset<size>() const {
		
		#define concat(a, b) a##b
		BOOST_STATIC_ASSERT(sizeof(base_type) <= sizeof(concat(unsi, gned) concat(lo, ng)));
		#undef concat
		
		std::bitset<size> result(0);
		for(size_t i = 0; i < count; i++) {
			result |= std::bitset<size>(bits[i]) << (i * base_size);
		}
		return result;
	}